

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O2

bool __thiscall RTIMUGD20M303DLHC::IMURead(RTIMUGD20M303DLHC *this)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  uint64_t uVar4;
  undefined2 uVar5;
  uchar status;
  uchar compassData [6];
  uchar accelData [6];
  uchar gyroData [6];
  
  bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            '\'','\x01',&status,"Failed to read L3GD20 status");
  if (((bVar3) && ((status & 8) != 0)) &&
     (bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_gyroSlaveAddr,0xa8,'\x06',gyroData,
                                "Failed to read L3GD20 data"), bVar3)) {
    uVar4 = RTMath::currentUSecsSinceEpoch();
    (this->super_RTIMU).m_imuData.timestamp = uVar4;
    bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                              this->m_accelSlaveAddr,0xa8,'\x06',accelData,
                              "Failed to read LSM303DLHC accel data");
    if ((bVar3) &&
       (bVar3 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_compassSlaveAddr,0x83,'\x06',compassData,
                                  "Failed to read LSM303DLHC compass data"), bVar3)) {
      RTMath::convertToVector(gyroData,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
      RTMath::convertToVector
                (accelData,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
      *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) =
           *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) ^ 0x8000000080000000;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -(this->super_RTIMU).m_imuData.accel.m_data[0]
      ;
      fVar1 = this->m_compassScaleXY;
      (this->super_RTIMU).m_imuData.compass.m_data[2] =
           -fVar1 * (float)(int)(short)(compassData._2_2_ << 8 | (ushort)compassData._2_2_ >> 8);
      uVar2 = (uint)compassData[5] << 0x10 | (uint)compassData[1] |
              CONCAT13(compassData[4],(uint3)compassData[0] << 8);
      uVar5 = (undefined2)(uVar2 >> 0x10);
      *(ulong *)(this->super_RTIMU).m_imuData.compass.m_data =
           CONCAT44(-this->m_compassScaleZ *
                    (float)(int)((long)CONCAT26(uVar5,CONCAT24(uVar5,uVar2)) >> 0x30),
                    fVar1 * (float)(int)(short)uVar2);
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      RTIMU::updateFusion(&this->super_RTIMU);
      return true;
    }
  }
  return false;
}

Assistant:

bool RTIMUGD20M303DLHC::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char compassData[6];


#ifdef GD20M303DLHC_CACHE_MODE
    int count;

    if (!m_settings->HALRead(m_gyroSlaveAddr, L3GD20_FIFO_SRC, 1, &status, "Failed to read L3GD20 fifo status"))
        return false;

    if ((status & 0x40) != 0) {
        HAL_INFO("L3GD20 fifo overrun\n");
        if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_CTRL5, 0x10, "Failed to set L3GD20 CTRL5"))
            return false;

        if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_FIFO_CTRL, 0x0, "Failed to set L3GD20 FIFO mode"))
            return false;

        if (!m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_FIFO_CTRL, 0x3f, "Failed to set L3GD20 FIFO mode"))
            return false;

        if (!setGyroCTRL5())
            return false;

        m_imuData.timestamp += m_sampleInterval * 32;
        return false;
    }

    // get count of samples in fifo
    count = status & 0x1f;

    if ((m_cacheCount == 0) && (count > 0) && (count < GD20M303DLHC_FIFO_THRESH)) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | L3GD20_OUT_X_L, 6, gyroData, "Failed to read L3GD20 data"))
            return false;

        if (!m_settings->HALRead(m_accelSlaveAddr, 0x80 | LSM303DLHC_OUT_X_L_A, 6, accelData, "Failed to read LSM303DLHC accel data"))
            return false;

        if (!m_settings->HALRead(m_compassSlaveAddr, 0x80 | LSM303DLHC_OUT_X_H_M, 6, compassData, "Failed to read LSM303DLHC compass data"))
            return false;

        if (m_firstTime)
            m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
        else
            m_imuData.timestamp += m_sampleInterval;

        m_firstTime = false;
    } else {
        if (count >=  GD20M303DLHC_FIFO_THRESH) {
            // need to create a cache block

            if (m_cacheCount == GD20M303DLHC_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == GD20M303DLHC_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | L3GD20_OUT_X_L, GD20M303DLHC_FIFO_CHUNK_SIZE * GD20M303DLHC_FIFO_THRESH,
                         m_cache[m_cacheIn].data, "Failed to read L3GD20 fifo data"))
                return false;

            if (!m_settings->HALRead(m_accelSlaveAddr, 0x80 | LSM303DLHC_OUT_X_L_A, 6,
                         m_cache[m_cacheIn].accel, "Failed to read LSM303DLHC accel data"))
                return false;

            if (!m_settings->HALRead(m_compassSlaveAddr, 0x80 | LSM303DLHC_OUT_X_H_M, 6,
                         m_cache[m_cacheIn].compass, "Failed to read LSM303DLHC compass data"))
                return false;

            m_cache[m_cacheIn].count = GD20M303DLHC_FIFO_THRESH;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == GD20M303DLHC_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(gyroData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, GD20M303DLHC_FIFO_CHUNK_SIZE);
        memcpy(accelData, m_cache[m_cacheOut].accel, 6);
        memcpy(compassData, m_cache[m_cacheOut].compass, 6);

        m_cache[m_cacheOut].index += GD20M303DLHC_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == GD20M303DLHC_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
        if (m_firstTime)
            m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
        else
            m_imuData.timestamp += m_sampleInterval;

        m_firstTime = false;
    }

#else
    if (!m_settings->HALRead(m_gyroSlaveAddr, L3GD20_STATUS, 1, &status, "Failed to read L3GD20 status"))
        return false;

    if ((status & 0x8) == 0)
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | L3GD20_OUT_X_L, 6, gyroData, "Failed to read L3GD20 data"))
        return false;

    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();

    if (!m_settings->HALRead(m_accelSlaveAddr, 0x80 | LSM303DLHC_OUT_X_L_A, 6, accelData, "Failed to read LSM303DLHC accel data"))
        return false;

    if (!m_settings->HALRead(m_compassSlaveAddr, 0x80 | LSM303DLHC_OUT_X_H_M, 6, compassData, "Failed to read LSM303DLHC compass data"))
        return false;

#endif

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);
    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);

    m_imuData.compass.setX((RTFLOAT)((int16_t)(((uint16_t)compassData[0] << 8) | (uint16_t)compassData[1])) * m_compassScaleXY);
    m_imuData.compass.setY((RTFLOAT)((int16_t)(((uint16_t)compassData[2] << 8) | (uint16_t)compassData[3])) * m_compassScaleXY);
    m_imuData.compass.setZ((RTFLOAT)((int16_t)(((uint16_t)compassData[4] << 8) | (uint16_t)compassData[5])) * m_compassScaleZ);

    //  sort out gyro axes

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  sort out compass axes

    RTFLOAT temp;

    temp = m_imuData.compass.z();
    m_imuData.compass.setZ(-m_imuData.compass.y());
    m_imuData.compass.setY(-temp);

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    //  now update the filter

    updateFusion();

    return true;
}